

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void synthesis(OpenJTalk *oj,char *txt)

{
  _Bool _Var1;
  size_t sVar2;
  char *in_RSI;
  long in_RDI;
  size_t sampling_frequency;
  size_t size;
  short *sounddata;
  size_t *in_stack_00000428;
  size_t *in_stack_00000430;
  short **in_stack_00000438;
  char *in_stack_00000440;
  Open_JTalk *in_stack_00000448;
  char *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  short *local_18;
  
  g_psd->length = 0;
  g_psd->sampling_frequency = 0;
  g_psd->data = (short *)0x0;
  if (((in_RDI != 0) && (in_RSI != (char *)0x0)) && (sVar2 = strlen(in_RSI), sVar2 != 0)) {
    if ((g_verbose & 1U) != 0) {
      console_message_string(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
    g_psd->length = 0;
    g_psd->sampling_frequency = 0;
    g_psd->data = (short *)0x0;
    _Var1 = Open_JTalk_generate_sounddata
                      (in_stack_00000448,in_stack_00000440,in_stack_00000438,in_stack_00000430,
                       in_stack_00000428);
    if (_Var1) {
      g_psd->length = (size_t)in_stack_ffffffffffffffe0;
      g_psd->sampling_frequency = (size_t)in_stack_ffffffffffffffd8;
      g_psd->data = local_18;
    }
  }
  return;
}

Assistant:

void synthesis(OpenJTalk *oj, const char *txt)
{
	g_psd->length = 0;
	g_psd->sampling_frequency = 0;
	g_psd->data = NULL;

	if (!oj)
	{
		return;
	}

	if (txt == NULL || strlen(txt) == 0)
	{
		return;
	}

	if (g_verbose)
	{
		console_message_string(u8"text： %s\n", (char*)txt);
	}

	g_psd->length = 0;
	g_psd->sampling_frequency = 0;
	g_psd->data = NULL;

	short *sounddata;
	size_t size;
	size_t sampling_frequency;
	if (Open_JTalk_generate_sounddata(
			oj->open_jtalk,
			txt,
			&sounddata,
			&size,
			&sampling_frequency))
	{
		g_psd->length = size;
		g_psd->sampling_frequency = sampling_frequency;
		g_psd->data = sounddata;
	}
}